

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

void Col_WordClearSynonym(Col_Word word)

{
  int iVar1;
  undefined8 local_18;
  Col_Word synonym;
  Col_Word word_local;
  
  iVar1 = HasSynonymField(word);
  if (iVar1 != 0) {
    local_18 = *(Col_Word *)(word + 8);
    iVar1 = HasSynonymField(local_18);
    if (iVar1 == 0) {
      *(undefined8 *)(word + 8) = 0;
    }
    else {
      for (; *(Col_Word *)(local_18 + 8) != word; local_18 = *(Col_Word *)(local_18 + 8)) {
      }
      *(undefined8 *)(local_18 + 8) = *(undefined8 *)(word + 8);
      *(undefined8 *)(word + 8) = 0;
    }
  }
  return;
}

Assistant:

void
Col_WordClearSynonym(
    Col_Word word)  /*!< The word to clear synonym for. */
{
    Col_Word synonym;

    if (!HasSynonymField(word)) {
        return;
    }

    synonym = WORD_SYNONYM(word);
    if (!HasSynonymField(synonym)) {
        /*
         * No synonym chain. Simply clear word's synonym field.
         */

        WORD_SYNONYM(word) = WORD_NIL;
        return;
    }

    /*
     * Find the synonym pointing back to this word, and remove word from the
     * chain.
     */

    while (WORD_SYNONYM(synonym) != word) {
        synonym = WORD_SYNONYM(synonym);
        ASSERT(HasSynonymField(synonym));
    }
    WORD_SYNONYM(synonym) = WORD_SYNONYM(word);
    WORD_SYNONYM(word) = WORD_NIL;
}